

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
kj::List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>::
addFront(List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>
         *this,TestElement *element)

{
  TestElement *pTVar1;
  TestElement *oldHead;
  TestElement *_oldHead109;
  TestElement *element_local;
  List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>
  *this_local;
  
  if ((element->link).prev != (Maybe<kj::(anonymous_namespace)::TestElement_&> *)0x0) {
    kj::_::throwDoubleAdd();
  }
  Maybe<kj::(anonymous_namespace)::TestElement_&>::operator=(&(element->link).next,&this->head);
  (element->link).prev = &this->head;
  pTVar1 = kj::_::readMaybe<kj::(anonymous_namespace)::TestElement>(&this->head);
  if (pTVar1 == (TestElement *)0x0) {
    this->tail = &(element->link).next;
  }
  else {
    (pTVar1->link).prev = &(element->link).next;
  }
  Maybe<kj::(anonymous_namespace)::TestElement_&>::operator=(&this->head,element);
  this->listSize = this->listSize + 1;
  return;
}

Assistant:

void addFront(T& element) {
    if ((element.*link).prev != nullptr) _::throwDoubleAdd();
    (element.*link).next = head;
    (element.*link).prev = &head;
    KJ_IF_SOME(oldHead, head) {
      (oldHead.*link).prev = &(element.*link).next;
    } else {
      tail = &(element.*link).next;
    }